

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

int __thiscall
cs_impl::any::
holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::kill(holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,__pid_t __pid,int __sig)

{
  undefined8 *puVar1;
  int extraout_EAX;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  (**(this->super_baseHolder)._vptr_baseHolder)
            (this,CONCAT44(in_register_00000034,__pid),CONCAT44(in_register_00000014,__sig));
  if ((DAT_0026d1f8 < 0x40) && (cs::global_thread_counter == 0)) {
    puVar1 = &holder<std::shared_ptr<std::__cxx11::stringstream>>::allocator + DAT_0026d1f8;
    DAT_0026d1f8 = DAT_0026d1f8 + 1;
    *puVar1 = this;
    return 0x26cff0;
  }
  operator_delete(this,0x18);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}